

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.h
# Opt level: O0

void __thiscall wasm::Module::Module(Module *this)

{
  Module *this_local;
  
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::vector(&this->exports);
  std::
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ::vector(&this->functions);
  std::
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ::vector(&this->globals);
  std::
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  ::vector(&this->tags);
  std::
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  ::vector(&this->elementSegments);
  std::
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  ::vector(&this->memories);
  std::
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  ::vector(&this->dataSegments);
  std::
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ::vector(&this->tables);
  Name::Name(&this->start);
  std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::vector
            (&this->customSections);
  std::unique_ptr<wasm::DylinkSection,std::default_delete<wasm::DylinkSection>>::
  unique_ptr<std::default_delete<wasm::DylinkSection>,void>
            ((unique_ptr<wasm::DylinkSection,std::default_delete<wasm::DylinkSection>> *)
             &this->dylinkSection);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->debugInfoFileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->debugInfoSymbolNames);
  std::__cxx11::string::string((string *)&this->debugInfoSourceRoot);
  std::__cxx11::string::string((string *)&this->debugInfoFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->debugInfoSourcesContent);
  FeatureSet::FeatureSet(&this->features,0);
  this->hasFeaturesSection = false;
  Name::Name(&this->name);
  std::
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  ::unordered_map(&this->typeNames);
  std::
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  ::unordered_map(&this->typeIndices);
  MixedArena::MixedArena(&this->allocator);
  std::
  unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
  ::unordered_map(&this->exportsMap);
  std::
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::unordered_map(&this->functionsMap);
  std::
  unordered_map<wasm::Name,_wasm::Table_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>_>
  ::unordered_map(&this->tablesMap);
  std::
  unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
  ::unordered_map(&this->memoriesMap);
  std::
  unordered_map<wasm::Name,_wasm::ElementSegment_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ElementSegment_*>_>_>
  ::unordered_map(&this->elementSegmentsMap);
  std::
  unordered_map<wasm::Name,_wasm::DataSegment_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>_>
  ::unordered_map(&this->dataSegmentsMap);
  std::
  unordered_map<wasm::Name,_wasm::Global_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Global_*>_>_>
  ::unordered_map(&this->globalsMap);
  std::
  unordered_map<wasm::Name,_wasm::Tag_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Tag_*>_>_>
  ::unordered_map(&this->tagsMap);
  return;
}

Assistant:

Module() = default;